

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O1

EVP_MD * cbs_to_md(CBS *cbs)

{
  ulong uVar1;
  int iVar2;
  EVP_MD *pEVar3;
  long lVar4;
  ulong __n;
  long lVar5;
  
  uVar1 = cbs->len;
  lVar5 = 0;
  while ((__n = (ulong)kMDOIDs[0].oid[lVar5 + 9], uVar1 != __n ||
         ((__n != 0 && (iVar2 = bcmp(cbs->data,kMDOIDs[0].oid + lVar5,__n), iVar2 != 0))))) {
    lVar5 = lVar5 + 0x10;
    if (lVar5 == 0x70) {
      return (EVP_MD *)0x0;
    }
  }
  if (*(int *)(kMDOIDs[0].oid + lVar5 + 0xc) == 0) {
    return (EVP_MD *)0x0;
  }
  lVar4 = 8;
  do {
    if (*(int *)(&UNK_001ed868 + lVar4) == *(int *)(kMDOIDs[0].oid + lVar5 + 0xc)) {
      pEVar3 = (EVP_MD *)(**(code **)((long)&nid_to_digest_mapping[0].nid + lVar4))();
      return pEVar3;
    }
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x248);
  return (EVP_MD *)0x0;
}

Assistant:

static const EVP_MD *cbs_to_md(const CBS *cbs) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kMDOIDs); i++) {
    if (CBS_len(cbs) == kMDOIDs[i].oid_len &&
        OPENSSL_memcmp(CBS_data(cbs), kMDOIDs[i].oid, kMDOIDs[i].oid_len) ==
            0) {
      return EVP_get_digestbynid(kMDOIDs[i].nid);
    }
  }

  return NULL;
}